

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O1

void __thiscall TApp_FileNotExists_Test::TestBody(TApp_FileNotExists_Test *this)

{
  App *this_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  Option *pOVar4;
  long *plVar5;
  long lVar6;
  char *in_R9;
  char *pcVar7;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  string myfile;
  string filename;
  AssertionResult gtest_ar;
  stat buffer;
  AssertHelper local_3c0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b8;
  AssertHelper local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  undefined1 local_368 [32];
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_348;
  string local_320;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined1 local_2c0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  undefined1 local_2b0 [16];
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  undefined1 local_280 [184];
  ios_base local_1c8 [264];
  stat local_c0;
  
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"TestNonFileNotUsed.txt","");
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      iVar3 = stat(local_388._M_dataplus._M_p,&local_c0);
      if (iVar3 == 0) {
        std::operator+(&local_2e0,"Path already exists: ",&local_388);
      }
      else {
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        local_2e0._M_string_length = 0;
        local_2e0.field_2._M_local_buf[0] = '\0';
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2ee,
               "Expected: CLI::NonexistentPath(myfile) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_368,(Message *)local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_368);
    if (local_2c0 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_2c0 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_2c0 + 8))();
      }
      local_2c0 = (undefined1  [8])0x0;
    }
  }
  local_368._0_8_ = local_368 + 0x10;
  local_368._8_8_ = 0;
  local_368[0x10] = '\0';
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"--file","");
  pcVar7 = "";
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"","");
  this_00 = &(this->super_TApp).app;
  pOVar4 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (this_00,&local_300,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368
                      ,&local_320);
  local_348.super__Function_base._M_functor._8_8_ = 0;
  local_348.super__Function_base._M_functor._M_unused._M_object = CLI::NonexistentPath;
  local_348._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_348.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  std::
  vector<std::function<std::__cxx11::string(std::__cxx11::string&)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string&)>>>
  ::emplace_back<std::function<std::__cxx11::string(std::__cxx11::string_const&)>&>
            ((vector<std::function<std::__cxx11::string(std::__cxx11::string&)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string&)>>>
              *)&pOVar4->validators_,&local_348);
  if (local_348.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_348.super__Function_base._M_manager)
              ((_Any_data *)&local_348,(_Any_data *)&local_348,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  local_2c0 = (undefined1  [8])local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"--file","");
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a0,local_388._M_dataplus._M_p,
             local_388._M_dataplus._M_p + local_388._M_string_length);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,local_2c0,local_280);
  lVar6 = 0;
  do {
    if (local_290 + lVar6 != *(undefined1 **)((long)local_2a0 + lVar6)) {
      operator_delete(*(undefined1 **)((long)local_2a0 + lVar6));
    }
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x40);
  TApp::run(&this->super_TApp);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_2c0,"myfile","filename",&local_388,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368);
  if (local_2c0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if (local_2b8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = ((local_2b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2f5,pcVar7);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((long *)local_3a8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3a8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3a8._M_dataplus._M_p + 8))();
      }
      local_3a8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  CLI::App::reset(this_00);
  std::ofstream::ofstream(local_2c0,local_388._M_dataplus._M_p,_S_out);
  plVar5 = (long *)std::ostream::put((char)local_2c0);
  bVar1 = *(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20);
  local_2c0 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_2c0 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&local_2b8);
  std::ios_base::~ios_base(local_1c8);
  bVar2 = (bVar1 & 5) == 0;
  local_3a8._M_dataplus._M_p._0_1_ = bVar2;
  local_3a8._M_string_length = 0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_3c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2c0,(internal *)&local_3a8,(AssertionResult *)"ok","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2fa,(char *)local_2c0);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (local_2c0 != (undefined1  [8])local_2b0) {
      operator_delete((void *)local_2c0);
    }
    if (local_3c0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3c0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3c0.data_ + 8))();
      }
      local_3c0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_2c0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_3a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x2fb,
             "Expected: run() throws an exception of type CLI::ValidationError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)local_2c0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
  if (local_2c0 != (undefined1  [8])0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && (local_2c0 != (undefined1  [8])0x0)) {
      (**(code **)(*(long *)local_2c0 + 8))();
    }
    local_2c0 = (undefined1  [8])0x0;
  }
  remove(local_388._M_dataplus._M_p);
  iVar3 = stat(local_388._M_dataplus._M_p,(stat *)local_2c0);
  if (iVar3 == 0) {
    if ((local_2b0[9] & 0x40) == 0) {
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      local_3a8._M_string_length = 0;
      local_3a8.field_2._M_local_buf[0] = '\0';
      goto LAB_00128ccc;
    }
    pcVar7 = "File is actually a directory: ";
  }
  else {
    pcVar7 = "File does not exist: ";
  }
  std::operator+(&local_3a8,pcVar7,&local_388);
LAB_00128ccc:
  local_3c0.data_._0_1_ = (internal)(local_3a8._M_string_length != 0);
  local_3b8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if (local_3c0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2c0,(internal *)&local_3c0,
               (AssertionResult *)"CLI::ExistingFile(myfile).empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2fe,(char *)local_2c0);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (local_2c0 != (undefined1  [8])local_2b0) {
      operator_delete((void *)local_2c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_3a8._M_dataplus._M_p + 8))();
      }
      local_3a8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((AssertHelperData *)local_368._0_8_ != (AssertHelperData *)(local_368 + 0x10)) {
    operator_delete((void *)local_368._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(TApp, FileNotExists) {
    std::string myfile{"TestNonFileNotUsed.txt"};
    EXPECT_NO_THROW(CLI::NonexistentPath(myfile));

    std::string filename;
    app.add_option("--file", filename)->check(CLI::NonexistentPath);
    args = {"--file", myfile};

    run();
    EXPECT_EQ(myfile, filename);

    app.reset();

    bool ok = static_cast<bool>(std::ofstream(myfile.c_str()).put('a')); // create file
    EXPECT_TRUE(ok);
    EXPECT_THROW(run(), CLI::ValidationError);

    std::remove(myfile.c_str());
    EXPECT_FALSE(CLI::ExistingFile(myfile).empty());
}